

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void __thiscall
embree::sse42::BVHNIntersector1<4,_1,_true,_embree::sse42::SubdivPatch1Intersector1>::intersect
          (BVHNIntersector1<4,_1,_true,_embree::sse42::SubdivPatch1Intersector1> *this,
          Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  Collider CVar8;
  uint *puVar9;
  code *pcVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 (*pauVar21) [16];
  int iVar22;
  undefined4 uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined8 uVar26;
  float *pfVar27;
  ulong uVar28;
  uint uVar29;
  RayQueryContext *pRVar30;
  long lVar31;
  ulong uVar32;
  undefined4 uVar33;
  ulong uVar34;
  long lVar35;
  Scene *pSVar36;
  ulong uVar37;
  undefined1 (*pauVar38) [16];
  ulong uVar39;
  ulong uVar40;
  float fVar41;
  float fVar70;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar71;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  float fVar83;
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  float fVar94;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar95;
  float fVar96;
  float fVar97;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar98;
  float fVar108;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar109;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar110;
  float fVar114;
  float fVar115;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar116;
  undefined1 auVar117 [12];
  undefined1 auVar118 [12];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar127;
  uint uVar128;
  float fVar129;
  uint uVar130;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar131;
  undefined1 auVar126 [16];
  uint uVar132;
  float fVar133;
  float fVar134;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar165;
  float fVar168;
  float fVar169;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar170;
  float fVar175;
  float fVar176;
  float fVar177;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar178;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar179;
  float fVar180;
  float fVar183;
  float fVar184;
  float fVar185;
  float fVar186;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  vbool<4> valid;
  MapUV<embree::sse42::GridSOA::Gather2x3> mapUV;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_1268 [16];
  int local_124c;
  undefined8 local_1248;
  float fStack_1240;
  float fStack_123c;
  undefined1 local_1238 [8];
  float fStack_1230;
  float fStack_122c;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  undefined8 local_1218;
  float fStack_1210;
  float fStack_120c;
  undefined8 local_1208;
  float fStack_1200;
  float fStack_11fc;
  ulong local_11f8;
  Intersectors *local_11f0;
  undefined8 local_11e8;
  float fStack_11e0;
  float fStack_11dc;
  undefined8 local_11d8;
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [16];
  undefined1 (*local_11b0) [16];
  ulong local_11a8;
  ulong local_11a0;
  int *local_1198;
  Scene *local_1190;
  RayQueryContext *local_1188;
  Intersectors *local_1180;
  float *local_1178;
  undefined4 local_1170;
  undefined1 local_1168 [8];
  float fStack_1160;
  float fStack_115c;
  undefined8 local_1158;
  float fStack_1150;
  float fStack_114c;
  undefined8 local_1148;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  undefined4 local_1134;
  undefined4 local_1130;
  float local_112c;
  float local_1128;
  undefined4 local_1124;
  undefined4 local_1120;
  float local_111c;
  float local_1118;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [8];
  float fStack_10f0;
  float fStack_10ec;
  float local_10e8;
  float fStack_10e4;
  float fStack_10e0;
  float fStack_10dc;
  float local_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  undefined1 (**local_10c8) [16];
  undefined1 local_10b8 [16];
  float local_10a8 [4];
  float local_1098 [4];
  float local_1088 [4];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  long local_1010;
  uint local_1008;
  uint uStack_1004;
  uint uStack_1000;
  uint uStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  undefined1 auVar56 [16];
  undefined1 auVar65 [16];
  
  if (*(long *)(*(long *)this + 0x70) == 8) {
    return;
  }
  pauVar38 = (undefined1 (*) [16])local_f68;
  local_f78 = *(long *)(*(long *)this + 0x70);
  uStack_f70 = 0;
  fVar94 = *(float *)&This->ptr;
  fVar70 = *(float *)((long)&This->ptr + 4);
  fVar97 = *(float *)&This->leafIntersector;
  fVar71 = *(float *)((long)&This->leafIntersector + 4);
  CVar8 = This->collider;
  fVar108 = 0.0;
  if (0.0 <= fVar71) {
    fVar108 = fVar71;
  }
  auVar149._4_4_ = -(uint)(ABS(CVar8.collide._4_4_) < 1e-18);
  auVar149._0_4_ = -(uint)(ABS(CVar8.collide._0_4_) < 1e-18);
  auVar149._8_4_ = -(uint)(ABS(CVar8.name._0_4_) < 1e-18);
  auVar149._12_4_ = -(uint)(ABS(CVar8.name._4_4_) < 1e-18);
  auVar148 = divps(_DAT_01f46a60,(undefined1  [16])CVar8);
  auVar149 = blendvps(auVar148,_DAT_01f76a70,auVar149);
  fVar71 = *(float *)&(This->intersector1).intersect;
  fVar144 = 0.0;
  if (0.0 <= fVar71) {
    fVar144 = fVar71;
  }
  fVar153 = auVar149._0_4_ * 0.99999964;
  fVar154 = auVar149._4_4_ * 0.99999964;
  fVar156 = auVar149._8_4_ * 0.99999964;
  fVar146 = auVar149._0_4_ * 1.0000004;
  fVar150 = auVar149._4_4_ * 1.0000004;
  fVar152 = auVar149._8_4_ * 1.0000004;
  uVar37 = (ulong)(fVar153 < 0.0) << 4;
  uVar40 = (ulong)(fVar154 < 0.0) << 4 | 0x20;
  uVar32 = (ulong)(fVar156 < 0.0) << 4 | 0x40;
  uVar39 = uVar37 ^ 0x10;
  auVar148._4_4_ = fVar144;
  auVar148._0_4_ = fVar144;
  auVar148._8_4_ = fVar144;
  auVar148._12_4_ = fVar144;
  _local_1008 = mm_lookupmask_ps._240_8_;
  _uStack_1000 = mm_lookupmask_ps._248_8_;
  uVar28 = 0;
  local_11f0 = This;
  local_f88 = fVar97;
  fStack_f84 = fVar97;
  fStack_f80 = fVar97;
  fStack_f7c = fVar97;
  local_f98 = fVar108;
  fStack_f94 = fVar108;
  fStack_f90 = fVar108;
  fStack_f8c = fVar108;
  local_fa8 = fVar152;
  fStack_fa4 = fVar152;
  fStack_fa0 = fVar152;
  fStack_f9c = fVar152;
  local_fb8 = fVar156;
  fStack_fb4 = fVar156;
  fStack_fb0 = fVar156;
  fStack_fac = fVar156;
  local_fc8 = fVar94;
  fStack_fc4 = fVar94;
  fStack_fc0 = fVar94;
  fStack_fbc = fVar94;
  local_fd8 = fVar70;
  fStack_fd4 = fVar70;
  fStack_fd0 = fVar70;
  fStack_fcc = fVar70;
  local_11f8 = uVar37;
  local_fe8 = fVar153;
  fStack_fe4 = fVar153;
  fStack_fe0 = fVar153;
  fStack_fdc = fVar153;
  local_ff8 = fVar154;
  fStack_ff4 = fVar154;
  fStack_ff0 = fVar154;
  fStack_fec = fVar154;
  local_1048 = fVar146;
  fStack_1044 = fVar146;
  fStack_1040 = fVar146;
  fStack_103c = fVar146;
  local_1108 = fVar150;
  fStack_1104 = fVar150;
  fStack_1100 = fVar150;
  fStack_10fc = fVar150;
  fVar71 = fVar97;
  fVar144 = fVar97;
  fVar145 = fVar97;
  fVar109 = fVar108;
  fVar168 = fVar108;
  fVar176 = fVar108;
  fVar177 = fVar156;
  fVar83 = fVar156;
  fVar95 = fVar156;
  fVar110 = fVar146;
  fVar178 = fVar146;
  fVar41 = fVar146;
  fVar82 = fVar150;
  fVar96 = fVar150;
  fVar98 = fVar150;
  fVar114 = fVar152;
  fVar115 = fVar152;
  fVar116 = fVar152;
  fVar127 = fVar94;
  fVar129 = fVar94;
  fVar131 = fVar94;
  fVar133 = fVar70;
  fVar134 = fVar70;
  fVar139 = fVar70;
  fVar140 = fVar153;
  fVar141 = fVar153;
  fVar142 = fVar153;
  fVar143 = fVar154;
  fVar147 = fVar154;
  fVar151 = fVar154;
  do {
    local_1010 = uVar28 + 0x30;
LAB_0069fa09:
    do {
      if (pauVar38 == (undefined1 (*) [16])&local_f78) {
        return;
      }
      pauVar21 = pauVar38 + -1;
      pauVar38 = pauVar38 + -1;
    } while (*(float *)&(This->intersector1).intersect <= *(float *)((long)*pauVar21 + 8) &&
             *(float *)((long)*pauVar21 + 8) != *(float *)&(This->intersector1).intersect);
    pRVar30 = *(RayQueryContext **)*pauVar38;
    while (((ulong)pRVar30 & 8) == 0) {
      pfVar4 = (float *)((long)&pRVar30[1].user + uVar37);
      auVar113._0_4_ = (*pfVar4 - fVar94) * fVar153;
      auVar113._4_4_ = (pfVar4[1] - fVar127) * fVar140;
      auVar113._8_4_ = (pfVar4[2] - fVar129) * fVar141;
      auVar113._12_4_ = (pfVar4[3] - fVar131) * fVar142;
      pfVar4 = (float *)((long)&pRVar30[1].user + uVar40);
      auVar125._0_4_ = (*pfVar4 - fVar70) * fVar154;
      auVar125._4_4_ = (pfVar4[1] - fVar133) * fVar143;
      auVar125._8_4_ = (pfVar4[2] - fVar134) * fVar147;
      auVar125._12_4_ = (pfVar4[3] - fVar139) * fVar151;
      auVar149 = maxps(auVar113,auVar125);
      pfVar4 = (float *)((long)&pRVar30[1].user + uVar32);
      auVar86._0_4_ = (*pfVar4 - fVar97) * fVar156;
      auVar86._4_4_ = (pfVar4[1] - fVar71) * fVar177;
      auVar86._8_4_ = (pfVar4[2] - fVar144) * fVar83;
      auVar86._12_4_ = (pfVar4[3] - fVar145) * fVar95;
      auVar87._4_4_ = fVar109;
      auVar87._0_4_ = fVar108;
      auVar87._8_4_ = fVar168;
      auVar87._12_4_ = fVar176;
      auVar87 = maxps(auVar86,auVar87);
      _local_10f8 = maxps(auVar149,auVar87);
      pfVar4 = (float *)((long)&pRVar30[1].user + uVar39);
      auVar88._0_4_ = (*pfVar4 - fVar94) * fVar146;
      auVar88._4_4_ = (pfVar4[1] - fVar127) * fVar110;
      auVar88._8_4_ = (pfVar4[2] - fVar129) * fVar178;
      auVar88._12_4_ = (pfVar4[3] - fVar131) * fVar41;
      pfVar4 = (float *)((long)&pRVar30[1].user + (uVar40 ^ 0x10));
      auVar99._0_4_ = (*pfVar4 - fVar70) * fVar150;
      auVar99._4_4_ = (pfVar4[1] - fVar133) * fVar82;
      auVar99._8_4_ = (pfVar4[2] - fVar134) * fVar96;
      auVar99._12_4_ = (pfVar4[3] - fVar139) * fVar98;
      auVar149 = minps(auVar88,auVar99);
      pfVar4 = (float *)((long)&pRVar30[1].user + (uVar32 ^ 0x10));
      auVar100._0_4_ = (*pfVar4 - fVar97) * fVar152;
      auVar100._4_4_ = (pfVar4[1] - fVar71) * fVar114;
      auVar100._8_4_ = (pfVar4[2] - fVar144) * fVar115;
      auVar100._12_4_ = (pfVar4[3] - fVar145) * fVar116;
      auVar87 = minps(auVar100,auVar148);
      auVar149 = minps(auVar149,auVar87);
      auVar120._4_4_ = -(uint)(local_10f8._4_4_ <= auVar149._4_4_);
      auVar120._0_4_ = -(uint)(local_10f8._0_4_ <= auVar149._0_4_);
      auVar120._8_4_ = -(uint)(local_10f8._8_4_ <= auVar149._8_4_);
      auVar120._12_4_ = -(uint)(local_10f8._12_4_ <= auVar149._12_4_);
      uVar29 = movmskps((int)context,auVar120);
      context = (RayQueryContext *)(ulong)uVar29;
      if (uVar29 == 0) goto LAB_0069fa09;
      uVar24 = (ulong)pRVar30 & 0xfffffffffffffff0;
      lVar35 = 0;
      if ((byte)uVar29 != 0) {
        for (; ((byte)uVar29 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
        }
      }
      pRVar30 = *(RayQueryContext **)(uVar24 + lVar35 * 8);
      uVar29 = (uVar29 & 0xff) - 1 & uVar29 & 0xff;
      context = pRVar30;
      if (uVar29 != 0) {
        uVar128 = *(uint *)(local_10f8 + lVar35 * 4);
        lVar35 = 0;
        if (uVar29 != 0) {
          for (; (uVar29 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
          }
        }
        context = *(RayQueryContext **)(uVar24 + lVar35 * 8);
        uVar130 = *(uint *)(local_10f8 + lVar35 * 4);
        uVar29 = uVar29 - 1 & uVar29;
        if (uVar29 == 0) {
          if (uVar128 < uVar130) {
            *(RayQueryContext **)*pauVar38 = context;
            *(uint *)((long)*pauVar38 + 8) = uVar130;
            context = pRVar30;
            pauVar38 = pauVar38 + 1;
          }
          else {
            *(RayQueryContext **)*pauVar38 = pRVar30;
            *(uint *)((long)*pauVar38 + 8) = uVar128;
            pRVar30 = context;
            pauVar38 = pauVar38 + 1;
          }
        }
        else {
          auVar89._8_4_ = uVar128;
          auVar89._0_8_ = pRVar30;
          auVar89._12_4_ = 0;
          auVar111._8_4_ = uVar130;
          auVar111._0_8_ = context;
          auVar111._12_4_ = 0;
          lVar35 = 0;
          if (uVar29 != 0) {
            for (; (uVar29 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
            }
          }
          uVar26 = *(undefined8 *)(uVar24 + lVar35 * 8);
          iVar22 = *(int *)(local_10f8 + lVar35 * 4);
          auVar101._8_4_ = iVar22;
          auVar101._0_8_ = uVar26;
          auVar101._12_4_ = 0;
          auVar42._8_4_ = -(uint)((int)uVar128 < (int)uVar130);
          uVar29 = uVar29 - 1 & uVar29;
          fVar110 = fStack_1044;
          fVar178 = fStack_1040;
          fVar41 = fStack_103c;
          fVar146 = local_1048;
          fVar82 = fStack_1104;
          fVar96 = fStack_1100;
          fVar98 = fStack_10fc;
          fVar150 = local_1108;
          if (uVar29 == 0) {
            auVar42._4_4_ = auVar42._8_4_;
            auVar42._0_4_ = auVar42._8_4_;
            auVar42._12_4_ = auVar42._8_4_;
            auVar119._8_4_ = uVar130;
            auVar119._0_8_ = context;
            auVar119._12_4_ = 0;
            auVar87 = blendvps(auVar119,auVar89,auVar42);
            auVar149 = blendvps(auVar89,auVar111,auVar42);
            auVar43._8_4_ = -(uint)(auVar87._8_4_ < iVar22);
            auVar43._4_4_ = auVar43._8_4_;
            auVar43._0_4_ = auVar43._8_4_;
            auVar43._12_4_ = auVar43._8_4_;
            auVar112._8_4_ = iVar22;
            auVar112._0_8_ = uVar26;
            auVar112._12_4_ = 0;
            auVar113 = blendvps(auVar112,auVar87,auVar43);
            auVar120 = blendvps(auVar87,auVar101,auVar43);
            auVar44._8_4_ = -(uint)(auVar149._8_4_ < auVar120._8_4_);
            auVar44._4_4_ = auVar44._8_4_;
            auVar44._0_4_ = auVar44._8_4_;
            auVar44._12_4_ = auVar44._8_4_;
            auVar87 = blendvps(auVar120,auVar149,auVar44);
            auVar149 = blendvps(auVar149,auVar120,auVar44);
            *pauVar38 = auVar149;
            pauVar38[1] = auVar87;
            pRVar30 = auVar113._0_8_;
            pauVar38 = pauVar38 + 2;
            context = pRVar30;
          }
          else {
            lVar35 = 0;
            if (uVar29 != 0) {
              for (; (uVar29 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
              }
            }
            auVar45._4_4_ = auVar42._8_4_;
            auVar45._0_4_ = auVar42._8_4_;
            auVar45._8_4_ = auVar42._8_4_;
            auVar45._12_4_ = auVar42._8_4_;
            auVar120 = blendvps(auVar111,auVar89,auVar45);
            auVar149 = blendvps(auVar89,auVar111,auVar45);
            auVar124._8_4_ = *(int *)(local_10f8 + lVar35 * 4);
            auVar124._0_8_ = *(undefined8 *)(uVar24 + lVar35 * 8);
            auVar124._12_4_ = 0;
            auVar46._8_4_ = -(uint)(iVar22 < *(int *)(local_10f8 + lVar35 * 4));
            auVar46._4_4_ = auVar46._8_4_;
            auVar46._0_4_ = auVar46._8_4_;
            auVar46._12_4_ = auVar46._8_4_;
            auVar113 = blendvps(auVar124,auVar101,auVar46);
            auVar87 = blendvps(auVar101,auVar124,auVar46);
            auVar47._8_4_ = -(uint)(auVar149._8_4_ < auVar87._8_4_);
            auVar47._4_4_ = auVar47._8_4_;
            auVar47._0_4_ = auVar47._8_4_;
            auVar47._12_4_ = auVar47._8_4_;
            auVar125 = blendvps(auVar87,auVar149,auVar47);
            auVar149 = blendvps(auVar149,auVar87,auVar47);
            auVar48._8_4_ = -(uint)(auVar120._8_4_ < auVar113._8_4_);
            auVar48._4_4_ = auVar48._8_4_;
            auVar48._0_4_ = auVar48._8_4_;
            auVar48._12_4_ = auVar48._8_4_;
            auVar87 = blendvps(auVar113,auVar120,auVar48);
            auVar120 = blendvps(auVar120,auVar113,auVar48);
            auVar49._8_4_ = -(uint)(auVar120._8_4_ < auVar125._8_4_);
            auVar49._4_4_ = auVar49._8_4_;
            auVar49._0_4_ = auVar49._8_4_;
            auVar49._12_4_ = auVar49._8_4_;
            auVar113 = blendvps(auVar125,auVar120,auVar49);
            auVar120 = blendvps(auVar120,auVar125,auVar49);
            *pauVar38 = auVar149;
            pauVar38[1] = auVar120;
            pauVar38[2] = auVar113;
            pRVar30 = auVar87._0_8_;
            pauVar38 = pauVar38 + 3;
            context = pRVar30;
          }
        }
      }
    }
    if (((uint)pRVar30 & 0xf) == 8) {
      uVar24 = (ulong)*(uint *)(uVar28 + 0xc);
      lVar31 = (ulong)*(uint *)(uVar28 + 0x24) + local_1010;
      lVar35 = lVar31 + ((ulong)pRVar30 >> 4) * 4;
      pfVar4 = (float *)(lVar31 + -4 + ((ulong)pRVar30 >> 4) * 4);
      fVar94 = pfVar4[1];
      pfVar5 = (float *)(lVar35 + -4 + uVar24 * 4);
      fVar70 = pfVar5[1];
      fVar97 = pfVar4[2];
      fVar71 = pfVar5[2];
      if (uVar24 == 2) {
        fVar97 = fVar94;
        fVar71 = fVar70;
      }
      uVar25 = (ulong)*(uint *)(uVar28 + 0x14);
      pfVar27 = (float *)(lVar35 + uVar25 * 4);
      fVar108 = *pfVar27;
      pfVar1 = pfVar27 + -1 + uVar24;
      fVar144 = pfVar1[1];
      fVar145 = pfVar1[2];
      fVar109 = pfVar27[1];
      if (uVar24 == 2) {
        fVar145 = fVar144;
        fVar109 = fVar108;
      }
      pfVar2 = (float *)(lVar35 + uVar25 * 8);
      context = (RayQueryContext *)(pfVar2 + -1);
      fVar168 = *pfVar2;
      pfVar3 = (float *)((long)&context->scene + uVar24 * 4);
      fVar176 = pfVar3[1];
      fVar156 = pfVar2[1];
      fVar177 = pfVar3[2];
      if (uVar24 == 2) {
        fVar156 = fVar168;
        fVar177 = fVar176;
      }
      fVar83 = *(float *)&This->ptr;
      fVar95 = *(float *)((long)&This->ptr + 4);
      fVar110 = *(float *)&This->leafIntersector;
      fVar178 = *(float *)&(This->collider).collide;
      local_1238._4_4_ = *(float *)((long)&(This->collider).collide + 4);
      fStack_1240 = *(float *)&(This->collider).name;
      fVar133 = *pfVar4 - fVar83;
      fVar139 = *pfVar5 - fVar83;
      fStack_1140 = fVar94 - fVar83;
      fStack_113c = fVar70 - fVar83;
      fVar154 = pfVar27[-1] - fVar95;
      fVar155 = *pfVar1 - fVar95;
      fStack_1150 = fVar108 - fVar95;
      fStack_114c = fVar144 - fVar95;
      local_1158 = CONCAT44(fVar155,fVar154);
      fVar157 = *(float *)&context->scene - fVar110;
      fVar161 = *pfVar3 - fVar110;
      fStack_1200 = fVar168 - fVar110;
      fStack_11fc = fVar176 - fVar110;
      fVar82 = fVar94 - fVar83;
      fVar94 = fVar94 - fVar83;
      fVar96 = fVar97 - fVar83;
      fVar97 = fVar97 - fVar83;
      fVar98 = fVar108 - fVar95;
      fVar108 = fVar108 - fVar95;
      fVar150 = fVar109 - fVar95;
      fVar109 = fVar109 - fVar95;
      fVar165 = fVar168 - fVar110;
      fVar168 = fVar168 - fVar110;
      fVar169 = fVar156 - fVar110;
      fVar156 = fVar156 - fVar110;
      fVar41 = *pfVar5 - fVar83;
      fVar146 = fVar70 - fVar83;
      fVar70 = fVar70 - fVar83;
      fVar71 = fVar71 - fVar83;
      fVar153 = *pfVar1 - fVar95;
      fVar143 = fVar144 - fVar95;
      fVar144 = fVar144 - fVar95;
      fVar145 = fVar145 - fVar95;
      fVar170 = *pfVar3 - fVar110;
      fVar175 = fVar176 - fVar110;
      fVar176 = fVar176 - fVar110;
      fVar177 = fVar177 - fVar110;
      fVar179 = fVar41 - fVar133;
      fVar183 = fVar146 - fVar139;
      fStack_11d0 = fVar70 - fStack_1140;
      fStack_11cc = fVar71 - fStack_113c;
      fVar83 = fVar153 - fVar154;
      fVar95 = fVar143 - fVar155;
      fStack_1210 = fVar144 - fStack_1150;
      fStack_120c = fVar145 - fStack_114c;
      fVar147 = fVar170 - fVar157;
      fVar151 = fVar175 - fVar161;
      fStack_11e0 = fVar176 - fStack_1200;
      fStack_11dc = fVar177 - fStack_11fc;
      local_11e8 = CONCAT44(fVar151,fVar147);
      local_1218 = (Scene *)CONCAT44(fVar95,fVar83);
      local_11d8 = (undefined4 *)CONCAT44(fVar183,fVar179);
      local_1248 = (RayQueryContext *)CONCAT44(fStack_1240,fStack_1240);
      fStack_123c = fStack_1240;
      fVar152 = fVar154 - fVar98;
      fVar127 = fVar155 - fVar108;
      fVar129 = fStack_1150 - fVar150;
      fVar131 = fStack_114c - fVar109;
      local_1228 = (fVar83 * (fVar170 + fVar157) - fVar147 * (fVar153 + fVar154)) * fVar178 +
                   (fVar147 * (fVar41 + fVar133) - (fVar170 + fVar157) * fVar179) *
                   (float)local_1238._4_4_ +
                   ((fVar153 + fVar154) * fVar179 - (fVar41 + fVar133) * fVar83) * fStack_1240;
      fStack_1224 = (fVar95 * (fVar175 + fVar161) - fVar151 * (fVar143 + fVar155)) * fVar178 +
                    (fVar151 * (fVar146 + fVar139) - (fVar175 + fVar161) * fVar183) *
                    (float)local_1238._4_4_ +
                    ((fVar143 + fVar155) * fVar183 - (fVar146 + fVar139) * fVar95) * fStack_1240;
      fStack_1220 = (fStack_1210 * (fVar176 + fStack_1200) - fStack_11e0 * (fVar144 + fStack_1150))
                    * fVar178 +
                    (fStack_11e0 * (fVar70 + fStack_1140) - (fVar176 + fStack_1200) * fStack_11d0) *
                    (float)local_1238._4_4_ +
                    ((fVar144 + fStack_1150) * fStack_11d0 - (fVar70 + fStack_1140) * fStack_1210) *
                    fStack_1240;
      fStack_121c = (fStack_120c * (fVar177 + fStack_11fc) - fStack_11dc * (fVar145 + fStack_114c))
                    * fVar178 +
                    (fStack_11dc * (fVar71 + fStack_113c) - (fVar177 + fStack_11fc) * fStack_11cc) *
                    (float)local_1238._4_4_ +
                    ((fVar145 + fStack_114c) * fStack_11cc - (fVar71 + fStack_113c) * fStack_120c) *
                    fStack_1240;
      fVar180 = fVar157 - fVar165;
      fVar184 = fVar161 - fVar168;
      fVar185 = fStack_1200 - fVar169;
      fVar186 = fStack_11fc - fVar156;
      local_1208 = (RayQueryContext *)CONCAT44(fVar161,fVar157);
      fVar158 = fVar133 - fVar82;
      fVar162 = fVar139 - fVar94;
      fVar163 = fStack_1140 - fVar96;
      fVar164 = fStack_113c - fVar97;
      local_1148 = CONCAT44(fVar139,fVar133);
      local_10e8 = (fVar152 * (fVar157 + fVar165) - fVar180 * (fVar154 + fVar98)) * fVar178 +
                   (fVar180 * (fVar133 + fVar82) - (fVar157 + fVar165) * fVar158) *
                   (float)local_1238._4_4_ +
                   ((fVar154 + fVar98) * fVar158 - (fVar133 + fVar82) * fVar152) * fStack_1240;
      fStack_10e4 = (fVar127 * (fVar161 + fVar168) - fVar184 * (fVar155 + fVar108)) * fVar178 +
                    (fVar184 * (fVar139 + fVar94) - (fVar161 + fVar168) * fVar162) *
                    (float)local_1238._4_4_ +
                    ((fVar155 + fVar108) * fVar162 - (fVar139 + fVar94) * fVar127) * fStack_1240;
      auVar90._0_8_ = CONCAT44(fStack_10e4,local_10e8);
      auVar90._8_4_ =
           (fVar129 * (fStack_1200 + fVar169) - fVar185 * (fStack_1150 + fVar150)) * fVar178 +
           (fVar185 * (fStack_1140 + fVar96) - (fStack_1200 + fVar169) * fVar163) *
           (float)local_1238._4_4_ +
           ((fStack_1150 + fVar150) * fVar163 - (fStack_1140 + fVar96) * fVar129) * fStack_1240;
      auVar90._12_4_ =
           (fVar131 * (fStack_11fc + fVar156) - fVar186 * (fStack_114c + fVar109)) * fVar178 +
           (fVar186 * (fStack_113c + fVar97) - (fStack_11fc + fVar156) * fVar164) *
           (float)local_1238._4_4_ +
           ((fStack_114c + fVar109) * fVar164 - (fStack_113c + fVar97) * fVar131) * fStack_1240;
      local_1028 = fVar82 - fVar41;
      fStack_1024 = fVar94 - fVar146;
      fStack_1020 = fVar96 - fVar70;
      fStack_101c = fVar97 - fVar71;
      fVar134 = fVar98 - fVar153;
      fVar140 = fVar108 - fVar143;
      fVar141 = fVar150 - fVar144;
      fVar142 = fVar109 - fVar145;
      fVar110 = fVar165 - fVar170;
      fVar114 = fVar168 - fVar175;
      fVar115 = fVar169 - fVar176;
      fVar116 = fVar156 - fVar177;
      fStack_1160 = auVar90._8_4_;
      local_1168 = (undefined1  [8])auVar90._0_8_;
      fStack_115c = auVar90._12_4_;
      local_1238._0_4_ = local_1238._4_4_;
      fStack_1230 = (float)local_1238._4_4_;
      fStack_122c = (float)local_1238._4_4_;
      auVar102._0_4_ =
           (fVar134 * (fVar170 + fVar165) - fVar110 * (fVar153 + fVar98)) * fVar178 +
           (fVar110 * (fVar41 + fVar82) - (fVar170 + fVar165) * local_1028) *
           (float)local_1238._4_4_ +
           ((fVar153 + fVar98) * local_1028 - (fVar41 + fVar82) * fVar134) * fStack_1240;
      auVar102._4_4_ =
           (fVar140 * (fVar175 + fVar168) - fVar114 * (fVar143 + fVar108)) * fVar178 +
           (fVar114 * (fVar146 + fVar94) - (fVar175 + fVar168) * fStack_1024) *
           (float)local_1238._4_4_ +
           ((fVar143 + fVar108) * fStack_1024 - (fVar146 + fVar94) * fVar140) * fStack_1240;
      auVar102._8_4_ =
           (fVar141 * (fVar176 + fVar169) - fVar115 * (fVar144 + fVar150)) * fVar178 +
           (fVar115 * (fVar70 + fVar96) - (fVar176 + fVar169) * fStack_1020) *
           (float)local_1238._4_4_ +
           ((fVar144 + fVar150) * fStack_1020 - (fVar70 + fVar96) * fVar141) * fStack_1240;
      auVar102._12_4_ =
           (fVar142 * (fVar177 + fVar156) - fVar116 * (fVar145 + fVar109)) * fVar178 +
           (fVar116 * (fVar71 + fVar97) - (fVar177 + fVar156) * fStack_101c) *
           (float)local_1238._4_4_ +
           ((fVar145 + fVar109) * fStack_101c - (fVar71 + fVar97) * fVar142) * fStack_1240;
      auVar19._4_4_ = fStack_1224;
      auVar19._0_4_ = local_1228;
      auVar19._8_4_ = fStack_1220;
      auVar19._12_4_ = fStack_121c;
      local_10d8 = local_1228 + local_10e8 + auVar102._0_4_;
      fStack_10d4 = fStack_1224 + fStack_10e4 + auVar102._4_4_;
      fStack_10d0 = fStack_1220 + auVar90._8_4_ + auVar102._8_4_;
      fStack_10cc = fStack_121c + auVar90._12_4_ + auVar102._12_4_;
      auVar149 = minps(auVar19,auVar90);
      auVar149 = minps(auVar149,auVar102);
      auVar148 = maxps(auVar19,auVar90);
      auVar148 = maxps(auVar148,auVar102);
      local_1038 = ABS(local_10d8);
      fStack_1034 = ABS(fStack_10d4);
      fStack_1030 = ABS(fStack_10d0);
      fStack_102c = ABS(fStack_10cc);
      uVar34 = (ulong)*(uint *)(uVar28 + 0x10);
      local_11b0 = (undefined1 (*) [16])(uVar25 * 0xc + lVar35 + -4);
      local_11a8 = uVar24;
      local_11a0 = uVar34;
      auVar166._0_4_ =
           -(uint)(auVar148._0_4_ <= local_1038 * 1.1920929e-07 ||
                  -(local_1038 * 1.1920929e-07) <= auVar149._0_4_) & local_1008;
      auVar166._4_4_ =
           -(uint)(auVar148._4_4_ <= fStack_1034 * 1.1920929e-07 ||
                  -(fStack_1034 * 1.1920929e-07) <= auVar149._4_4_) & uStack_1004;
      auVar166._8_4_ =
           -(uint)(auVar148._8_4_ <= fStack_1030 * 1.1920929e-07 ||
                  -(fStack_1030 * 1.1920929e-07) <= auVar149._8_4_) & uStack_1000;
      auVar166._12_4_ =
           -(uint)(auVar148._12_4_ <= fStack_102c * 1.1920929e-07 ||
                  -(fStack_102c * 1.1920929e-07) <= auVar149._12_4_) & uStack_ffc;
      iVar22 = movmskps((int)local_11b0,auVar166);
      if (iVar22 != 0) {
        auVar171._0_4_ = fVar83 * fVar180 - fVar147 * fVar152;
        auVar171._4_4_ = fVar95 * fVar184 - fVar151 * fVar127;
        auVar171._8_4_ = fStack_1210 * fVar185 - fStack_11e0 * fVar129;
        auVar171._12_4_ = fStack_120c * fVar186 - fStack_11dc * fVar131;
        auVar126._0_4_ = fVar152 * fVar110 - fVar180 * fVar134;
        auVar126._4_4_ = fVar127 * fVar114 - fVar184 * fVar140;
        auVar126._8_4_ = fVar129 * fVar115 - fVar185 * fVar141;
        auVar126._12_4_ = fVar131 * fVar116 - fVar186 * fVar142;
        auVar50._4_4_ = -(uint)(ABS(fVar151 * fVar127) < ABS(fVar184 * fVar140));
        auVar50._0_4_ = -(uint)(ABS(fVar147 * fVar152) < ABS(fVar180 * fVar134));
        auVar50._8_4_ = -(uint)(ABS(fStack_11e0 * fVar129) < ABS(fVar185 * fVar141));
        auVar50._12_4_ = -(uint)(ABS(fStack_11dc * fVar131) < ABS(fVar186 * fVar142));
        local_1078 = blendvps(auVar126,auVar171,auVar50);
        auVar135._0_4_ = fVar147 * fVar158 - fVar179 * fVar180;
        auVar135._4_4_ = fVar151 * fVar162 - fVar183 * fVar184;
        auVar135._8_4_ = fStack_11e0 * fVar163 - fStack_11d0 * fVar185;
        auVar135._12_4_ = fStack_11dc * fVar164 - fStack_11cc * fVar186;
        auVar181._0_4_ = fVar180 * local_1028 - fVar158 * fVar110;
        auVar181._4_4_ = fVar184 * fStack_1024 - fVar162 * fVar114;
        auVar181._8_4_ = fVar185 * fStack_1020 - fVar163 * fVar115;
        auVar181._12_4_ = fVar186 * fStack_101c - fVar164 * fVar116;
        auVar51._4_4_ = -(uint)(ABS(fVar183 * fVar184) < ABS(fVar162 * fVar114));
        auVar51._0_4_ = -(uint)(ABS(fVar179 * fVar180) < ABS(fVar158 * fVar110));
        auVar51._8_4_ = -(uint)(ABS(fStack_11d0 * fVar185) < ABS(fVar163 * fVar115));
        auVar51._12_4_ = -(uint)(ABS(fStack_11cc * fVar186) < ABS(fVar164 * fVar116));
        local_1068 = blendvps(auVar181,auVar135,auVar51);
        auVar159._0_4_ = fVar158 * fVar134 - fVar152 * local_1028;
        auVar159._4_4_ = fVar162 * fVar140 - fVar127 * fStack_1024;
        auVar159._8_4_ = fVar163 * fVar141 - fVar129 * fStack_1020;
        auVar159._12_4_ = fVar164 * fVar142 - fVar131 * fStack_101c;
        auVar52._4_4_ = -(uint)(ABS(fVar95 * fVar162) < ABS(fVar127 * fStack_1024));
        auVar52._0_4_ = -(uint)(ABS(fVar83 * fVar158) < ABS(fVar152 * local_1028));
        auVar52._8_4_ = -(uint)(ABS(fStack_1210 * fVar163) < ABS(fVar129 * fStack_1020));
        auVar52._12_4_ = -(uint)(ABS(fStack_120c * fVar164) < ABS(fVar131 * fStack_101c));
        auVar13._4_4_ = fVar183 * fVar127 - fVar95 * fVar162;
        auVar13._0_4_ = fVar179 * fVar152 - fVar83 * fVar158;
        auVar13._8_4_ = fStack_11d0 * fVar129 - fStack_1210 * fVar163;
        auVar13._12_4_ = fStack_11cc * fVar131 - fStack_120c * fVar164;
        local_1058 = blendvps(auVar159,auVar13,auVar52);
        fVar94 = fVar178 * local_1078._0_4_ +
                 (float)local_1238._4_4_ * local_1068._0_4_ + fStack_1240 * local_1058._0_4_;
        fVar70 = fVar178 * local_1078._4_4_ +
                 (float)local_1238._4_4_ * local_1068._4_4_ + fStack_1240 * local_1058._4_4_;
        fVar97 = fVar178 * local_1078._8_4_ +
                 (float)local_1238._4_4_ * local_1068._8_4_ + fStack_1240 * local_1058._8_4_;
        fVar71 = fVar178 * local_1078._12_4_ +
                 (float)local_1238._4_4_ * local_1068._12_4_ + fStack_1240 * local_1058._12_4_;
        auVar72._0_4_ = fVar94 + fVar94;
        auVar72._4_4_ = fVar70 + fVar70;
        auVar72._8_4_ = fVar97 + fVar97;
        auVar72._12_4_ = fVar71 + fVar71;
        auVar53._0_4_ = fVar157 * local_1058._0_4_;
        auVar53._4_4_ = fVar161 * local_1058._4_4_;
        auVar53._8_4_ = fStack_1200 * local_1058._8_4_;
        auVar53._12_4_ = fStack_11fc * local_1058._12_4_;
        fVar70 = fVar133 * local_1078._0_4_ + fVar154 * local_1068._0_4_ + auVar53._0_4_;
        fVar144 = fVar139 * local_1078._4_4_ + fVar155 * local_1068._4_4_ + auVar53._4_4_;
        fVar145 = fStack_1140 * local_1078._8_4_ + fStack_1150 * local_1068._8_4_ + auVar53._8_4_;
        fVar109 = fStack_113c * local_1078._12_4_ + fStack_114c * local_1068._12_4_ + auVar53._12_4_
        ;
        auVar149 = rcpps(auVar53,auVar72);
        fVar94 = auVar149._0_4_;
        fVar97 = auVar149._4_4_;
        fVar71 = auVar149._8_4_;
        fVar108 = auVar149._12_4_;
        fVar70 = ((1.0 - auVar72._0_4_ * fVar94) * fVar94 + fVar94) * (fVar70 + fVar70);
        fVar97 = ((1.0 - auVar72._4_4_ * fVar97) * fVar97 + fVar97) * (fVar144 + fVar144);
        fVar71 = ((1.0 - auVar72._8_4_ * fVar71) * fVar71 + fVar71) * (fVar145 + fVar145);
        fVar108 = ((1.0 - auVar72._12_4_ * fVar108) * fVar108 + fVar108) * (fVar109 + fVar109);
        local_1238 = (undefined1  [8])(This->intersector1).intersect;
        _fStack_1230 = (This->intersector1).occluded;
        fVar144 = SUB84(local_1238,0);
        fVar94 = *(float *)((long)&This->leafIntersector + 4);
        auVar54._4_4_ = -(uint)(fVar94 <= fVar97);
        auVar54._0_4_ = -(uint)(fVar94 <= fVar70);
        auVar54._8_4_ = -(uint)(fVar94 <= fVar71);
        auVar54._12_4_ = -(uint)(fVar94 <= fVar108);
        auVar73._0_4_ =
             (int)((uint)(auVar72._0_4_ != 0.0 && (fVar70 <= fVar144 && fVar94 <= fVar70)) *
                  -0x80000000) >> 0x1f;
        auVar73._4_4_ =
             (int)((uint)(auVar72._4_4_ != 0.0 && (fVar97 <= fVar144 && fVar94 <= fVar97)) *
                  -0x80000000) >> 0x1f;
        auVar73._8_4_ =
             (int)((uint)(auVar72._8_4_ != 0.0 && (fVar71 <= fVar144 && fVar94 <= fVar71)) *
                  -0x80000000) >> 0x1f;
        auVar73._12_4_ =
             (int)((uint)(auVar72._12_4_ != 0.0 && (fVar108 <= fVar144 && fVar94 <= fVar108)) *
                  -0x80000000) >> 0x1f;
        auVar74 = auVar73 & auVar166;
        iVar22 = movmskps(iVar22,auVar74);
        if (iVar22 != 0) {
          uVar29 = *(uint *)(uVar28 + 0x18);
          uVar33 = *(undefined4 *)(uVar28 + 0x1c);
          uVar26 = extractps(_local_1238,1);
          local_10f8._4_4_ = fStack_1224;
          local_10f8._0_4_ = local_1228;
          fStack_10f0 = fStack_1220;
          fStack_10ec = fStack_121c;
          fStack_10e0 = auVar90._8_4_;
          fStack_10dc = auVar90._12_4_;
          local_10c8 = &local_11b0;
          local_10b8 = auVar74;
          local_1088[0] = fVar70;
          local_1088[1] = fVar97;
          local_1088[2] = fVar71;
          local_1088[3] = fVar108;
          context = *(RayQueryContext **)
                     (*(long *)(*(long *)&(ray->super_RayK<1>).org.field_0 + 0x1e8) +
                     (ulong)uVar29 * 8);
          local_1248 = context;
          if (((uint)*(float *)((long)&context[2].scene + 4) & (uint)uVar26) != 0) {
            local_11c8 = auVar74;
            auVar11._4_4_ = fStack_10d4;
            auVar11._0_4_ = local_10d8;
            auVar11._8_4_ = fStack_10d0;
            auVar11._12_4_ = fStack_10cc;
            auVar149 = rcpps(auVar54,auVar11);
            fVar94 = auVar149._0_4_;
            fVar144 = auVar149._4_4_;
            fVar145 = auVar149._8_4_;
            fVar109 = auVar149._12_4_;
            fVar94 = (float)(-(uint)(1e-18 <= local_1038) &
                            (uint)(((float)DAT_01f46a60 - local_10d8 * fVar94) * fVar94 + fVar94));
            fVar144 = (float)(-(uint)(1e-18 <= fStack_1034) &
                             (uint)((DAT_01f46a60._4_4_ - fStack_10d4 * fVar144) * fVar144 + fVar144
                                   ));
            fVar145 = (float)(-(uint)(1e-18 <= fStack_1030) &
                             (uint)((DAT_01f46a60._8_4_ - fStack_10d0 * fVar145) * fVar145 + fVar145
                                   ));
            fVar109 = (float)(-(uint)(1e-18 <= fStack_102c) &
                             (uint)((DAT_01f46a60._12_4_ - fStack_10cc * fVar109) * fVar109 +
                                   fVar109));
            auVar136._0_4_ = local_1228 * fVar94;
            auVar136._4_4_ = fStack_1224 * fVar144;
            auVar136._8_4_ = fStack_1220 * fVar145;
            auVar136._12_4_ = fStack_121c * fVar109;
            auVar87 = minps(auVar136,_DAT_01f46a60);
            auVar172._0_4_ = local_10e8 * fVar94;
            auVar172._4_4_ = fStack_10e4 * fVar144;
            auVar172._8_4_ = auVar90._8_4_ * fVar145;
            auVar172._12_4_ = auVar90._12_4_ * fVar109;
            auVar113 = minps(auVar172,_DAT_01f46a60);
            auVar149 = *local_11b0;
            auVar117 = auVar149._0_12_;
            auVar148 = *(undefined1 (*) [16])(*local_11b0 + uVar24 * 4);
            auVar84 = auVar148._0_12_;
            fVar94 = auVar87._12_4_;
            if (uVar24 == 2) {
              auVar117._0_8_ = auVar149._0_8_;
              auVar117._8_4_ = auVar149._4_4_;
              auVar84._0_8_ = auVar148._0_8_;
              auVar84._8_4_ = auVar148._4_4_;
            }
            auVar121._4_4_ = auVar117._4_4_;
            auVar121._8_4_ = auVar117._8_4_;
            auVar56._0_8_ = auVar117._0_8_;
            auVar56._8_4_ = auVar121._4_4_;
            uVar130 = auVar84._4_4_;
            auVar56._12_4_ = uVar130;
            auVar55._8_8_ = auVar56._8_8_;
            auVar55._0_4_ = auVar117._0_4_;
            uVar128 = auVar84._0_4_;
            auVar55._4_4_ = uVar128;
            auVar121._0_4_ = auVar121._4_4_;
            auVar121._12_4_ = auVar121._8_4_;
            auVar91._0_8_ = auVar84._0_8_;
            auVar91._8_4_ = uVar130;
            auVar91._12_4_ = auVar84._8_4_;
            auVar149 = pblendw(auVar55,ZEXT816(0),0xaa);
            auVar120 = pblendw(auVar121,ZEXT816(0),0xaa);
            auVar148 = pblendw(auVar91,ZEXT816(0),0xaa);
            fVar176 = auVar87._0_4_;
            fVar156 = auVar87._4_4_;
            fVar177 = auVar87._8_4_;
            fVar83 = auVar113._0_4_;
            fVar95 = auVar113._4_4_;
            fVar110 = auVar113._8_4_;
            fVar178 = auVar113._12_4_;
            fVar144 = (1.0 - fVar176) - fVar83;
            fVar145 = (1.0 - fVar156) - fVar95;
            fVar109 = (1.0 - fVar177) - fVar110;
            fVar168 = (1.0 - fVar94) - fVar178;
            local_10a8[0] =
                 (float)auVar149._0_4_ * 0.00012207031 * fVar144 +
                 (float)auVar148._0_4_ * 0.00012207031 * fVar83 +
                 (float)auVar120._0_4_ * 0.00012207031 * fVar176;
            local_10a8[1] =
                 (float)auVar149._4_4_ * 0.00012207031 * fVar145 +
                 (float)auVar148._4_4_ * 0.00012207031 * fVar95 +
                 (float)auVar120._4_4_ * 0.00012207031 * fVar156;
            local_10a8[2] =
                 (float)auVar149._8_4_ * 0.00012207031 * fVar109 +
                 (float)auVar148._8_4_ * 0.00012207031 * fVar110 +
                 (float)auVar120._8_4_ * 0.00012207031 * fVar177;
            local_10a8[3] =
                 (float)auVar149._12_4_ * 0.00012207031 * fVar168 +
                 (float)auVar148._12_4_ * 0.00012207031 * fVar178 +
                 (float)auVar120._12_4_ * 0.00012207031 * fVar94;
            local_1098[0] =
                 fVar144 * (float)(auVar55._0_4_ >> 0x10) * 0.00012207031 +
                 (float)(uVar128 >> 0x10) * 0.00012207031 * fVar83 +
                 (float)(auVar121._4_4_ >> 0x10) * 0.00012207031 * fVar176;
            local_1098[1] =
                 fVar145 * (float)(uVar128 >> 0x10) * 0.00012207031 +
                 (float)(uVar130 >> 0x10) * 0.00012207031 * fVar95 +
                 (float)(auVar121._4_4_ >> 0x10) * 0.00012207031 * fVar156;
            local_1098[2] =
                 fVar109 * (float)(auVar121._4_4_ >> 0x10) * 0.00012207031 +
                 (float)(uVar130 >> 0x10) * 0.00012207031 * fVar110 +
                 (float)(auVar121._8_4_ >> 0x10) * 0.00012207031 * fVar177;
            local_1098[3] =
                 fVar168 * (float)(uVar130 >> 0x10) * 0.00012207031 +
                 (float)(auVar84._8_4_ >> 0x10) * 0.00012207031 * fVar178 +
                 (float)(auVar121._8_4_ >> 0x10) * 0.00012207031 * fVar94;
            auVar15._4_4_ = fVar97;
            auVar15._0_4_ = fVar70;
            auVar15._8_4_ = fVar71;
            auVar15._12_4_ = fVar108;
            auVar148 = blendvps(_DAT_01f45a30,auVar15,auVar74);
            auVar103._4_4_ = auVar148._0_4_;
            auVar103._0_4_ = auVar148._4_4_;
            auVar103._8_4_ = auVar148._12_4_;
            auVar103._12_4_ = auVar148._8_4_;
            auVar149 = minps(auVar103,auVar148);
            auVar57._0_8_ = auVar149._8_8_;
            auVar57._8_4_ = auVar149._0_4_;
            auVar57._12_4_ = auVar149._4_4_;
            auVar149 = minps(auVar57,auVar149);
            auVar58._0_8_ =
                 CONCAT44(-(uint)(auVar149._4_4_ == auVar148._4_4_) & auVar74._4_4_,
                          -(uint)(auVar149._0_4_ == auVar148._0_4_) & auVar74._0_4_);
            auVar58._8_4_ = -(uint)(auVar149._8_4_ == auVar148._8_4_) & auVar74._8_4_;
            auVar58._12_4_ = -(uint)(auVar149._12_4_ == auVar148._12_4_) & auVar74._12_4_;
            iVar22 = movmskps((int)local_11b0,auVar58);
            if (iVar22 != 0) {
              auVar74._8_4_ = auVar58._8_4_;
              auVar74._0_8_ = auVar58._0_8_;
              auVar74._12_4_ = auVar58._12_4_;
            }
            uVar23 = movmskps(iVar22,auVar74);
            uVar25 = CONCAT44((int)((ulong)local_11b0 >> 0x20),uVar23);
            lVar31 = 0;
            if (uVar25 != 0) {
              for (; (uVar25 >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
              }
            }
            local_1208 = *(RayQueryContext **)&(ray->super_RayK<1>).dir.field_0;
            if ((local_1208->args == (RTCIntersectArguments *)0x0) &&
               (context[2].args == (RTCIntersectArguments *)0x0)) {
              fVar94 = local_10a8[lVar31];
              fVar70 = local_1098[lVar31];
              uVar23 = *(undefined4 *)(local_1078 + lVar31 * 4);
              uVar6 = *(undefined4 *)(local_1068 + lVar31 * 4);
              uVar7 = *(undefined4 *)(local_1058 + lVar31 * 4);
              *(float *)&(This->intersector1).intersect = local_1088[lVar31];
              *(undefined4 *)&(This->intersector1).pointQuery = uVar23;
              *(undefined4 *)((long)&(This->intersector1).pointQuery + 4) = uVar6;
              *(undefined4 *)&(This->intersector1).name = uVar7;
              *(float *)((long)&(This->intersector1).name + 4) = fVar94;
              *(float *)&(This->intersector4).intersect = fVar70;
              *(undefined4 *)((long)&(This->intersector4).intersect + 4) = uVar33;
              *(uint *)&(This->intersector4).occluded = uVar29;
              puVar9 = *(uint **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
              uVar29 = *puVar9;
              context = (RayQueryContext *)(ulong)uVar29;
              *(uint *)((long)&(This->intersector4).occluded + 4) = uVar29;
              *(uint *)&(This->intersector4).name = puVar9[1];
            }
            else {
              local_11d8 = *(undefined4 **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
              local_1218 = (Scene *)uVar24;
              local_1148 = uVar34;
              local_1158 = lVar35;
              local_1168._4_4_ = fVar97;
              local_1168._0_4_ = fVar70;
              fStack_1160 = fVar71;
              fStack_115c = fVar108;
              local_11e8 = (ulong)uVar29;
LAB_006a0b4a:
              local_112c = local_10a8[lVar31];
              local_1128 = local_1098[lVar31];
              *(float *)&(This->intersector1).intersect = local_1088[lVar31];
              local_1228 = (float)lVar31;
              fStack_1224 = (float)((ulong)lVar31 >> 0x20);
              local_1138 = *(float *)(local_1078 + lVar31 * 4);
              local_1134 = *(undefined4 *)(local_1068 + lVar31 * 4);
              local_1130 = *(undefined4 *)(local_1058 + lVar31 * 4);
              local_1124 = uVar33;
              local_1120 = (int)local_11e8;
              local_111c = (float)*local_11d8;
              local_1118 = (float)local_11d8[1];
              local_124c = -1;
              local_1198 = &local_124c;
              local_1190 = local_1248[1].scene;
              local_1188 = (RayQueryContext *)local_11d8;
              local_1180 = This;
              local_1178 = &local_1138;
              local_1170 = 1;
              if (local_1248[2].args == (RTCIntersectArguments *)0x0) {
LAB_006a0c88:
                if ((local_1208->args != (RTCIntersectArguments *)0x0) &&
                   ((context = local_1208, ((ulong)local_1208->scene & 2) != 0 ||
                    (context = local_1248, ((ulong)local_1248[2].user & 0x40000000000000) != 0)))) {
                  (*(code *)local_1208->args)(&local_1198);
                  This = local_11f0;
                  uVar24 = (ulong)local_1218;
                  uVar34 = local_1148;
                  lVar35 = local_1158;
                  uVar37 = local_11f8;
                  fVar70 = (float)local_1168._0_4_;
                  fVar97 = (float)local_1168._4_4_;
                  fVar71 = fStack_1160;
                  fVar108 = fStack_115c;
                  if (*local_1198 == 0) goto LAB_006a0d4f;
                }
                *(float *)&(local_1180->intersector1).pointQuery = *local_1178;
                *(float *)((long)&(local_1180->intersector1).pointQuery + 4) = local_1178[1];
                *(float *)&(local_1180->intersector1).name = local_1178[2];
                *(float *)((long)&(local_1180->intersector1).name + 4) = local_1178[3];
                *(float *)&(local_1180->intersector4).intersect = local_1178[4];
                *(float *)((long)&(local_1180->intersector4).intersect + 4) = local_1178[5];
                *(float *)&(local_1180->intersector4).occluded = local_1178[6];
                *(float *)((long)&(local_1180->intersector4).occluded + 4) = local_1178[7];
                context = (RayQueryContext *)(ulong)(uint)local_1178[8];
                *(float *)&(local_1180->intersector4).name = local_1178[8];
              }
              else {
                context = local_1248;
                (*(code *)local_1248[2].args)(&local_1198);
                This = local_11f0;
                uVar24 = (ulong)local_1218;
                uVar34 = local_1148;
                lVar35 = local_1158;
                uVar37 = local_11f8;
                fVar70 = (float)local_1168._0_4_;
                fVar97 = (float)local_1168._4_4_;
                fVar71 = fStack_1160;
                fVar108 = fStack_115c;
                if (*local_1198 != 0) goto LAB_006a0c88;
LAB_006a0d4f:
                *(undefined4 *)&(local_11f0->intersector1).intersect = local_1238._0_4_;
                This = local_11f0;
                uVar24 = (ulong)local_1218;
                uVar34 = local_1148;
                lVar35 = local_1158;
                uVar37 = local_11f8;
                fVar70 = (float)local_1168._0_4_;
                fVar97 = (float)local_1168._4_4_;
                fVar71 = fStack_1160;
                fVar108 = fStack_115c;
              }
              *(undefined4 *)(local_11c8 + CONCAT44(fStack_1224,local_1228) * 4) = 0;
              local_1238 = (undefined1  [8])(This->intersector1).intersect;
              _fStack_1230 = (This->intersector1).occluded;
              fVar94 = SUB84(local_1238,0);
              auVar68._0_4_ = -(uint)(fVar70 <= fVar94) & local_11c8._0_4_;
              auVar68._4_4_ = -(uint)(fVar97 <= fVar94) & local_11c8._4_4_;
              auVar68._8_4_ = -(uint)(fVar71 <= fVar94) & local_11c8._8_4_;
              auVar68._12_4_ = -(uint)(fVar108 <= fVar94) & local_11c8._12_4_;
              local_11c8 = auVar68;
              iVar22 = movmskps(local_1228,auVar68);
              if (iVar22 != 0) {
                auVar18._4_4_ = fVar97;
                auVar18._0_4_ = fVar70;
                auVar18._8_4_ = fVar71;
                auVar18._12_4_ = fVar108;
                auVar148 = blendvps(_DAT_01f45a30,auVar18,auVar68);
                auVar106._4_4_ = auVar148._0_4_;
                auVar106._0_4_ = auVar148._4_4_;
                auVar106._8_4_ = auVar148._12_4_;
                auVar106._12_4_ = auVar148._8_4_;
                auVar149 = minps(auVar106,auVar148);
                auVar78._0_8_ = auVar149._8_8_;
                auVar78._8_4_ = auVar149._0_4_;
                auVar78._12_4_ = auVar149._4_4_;
                auVar149 = minps(auVar78,auVar149);
                auVar79._0_8_ =
                     CONCAT44(-(uint)(auVar149._4_4_ == auVar148._4_4_) & auVar68._4_4_,
                              -(uint)(auVar149._0_4_ == auVar148._0_4_) & auVar68._0_4_);
                auVar79._8_4_ = -(uint)(auVar149._8_4_ == auVar148._8_4_) & auVar68._8_4_;
                auVar79._12_4_ = -(uint)(auVar149._12_4_ == auVar148._12_4_) & auVar68._12_4_;
                iVar22 = movmskps(iVar22,auVar79);
                if (iVar22 != 0) {
                  auVar68._8_4_ = auVar79._8_4_;
                  auVar68._0_8_ = auVar79._0_8_;
                  auVar68._12_4_ = auVar79._12_4_;
                }
                uVar23 = movmskps(iVar22,auVar68);
                lVar31 = 0;
                if (CONCAT44(fStack_1224,uVar23) != 0) {
                  for (; (CONCAT44(fStack_1224,uVar23) >> lVar31 & 1) == 0; lVar31 = lVar31 + 1) {
                  }
                }
                goto LAB_006a0b4a;
              }
            }
          }
        }
      }
      if (2 < (uint)uVar34) {
        pfVar4 = (float *)(lVar35 + uVar24 * 4);
        pfVar27 = pfVar4 + -1;
        fVar94 = *pfVar4;
        pfVar5 = pfVar27 + uVar24;
        fVar70 = pfVar5[1];
        fVar97 = pfVar4[1];
        fVar71 = pfVar5[2];
        if (uVar24 == 2) {
          fVar97 = fVar94;
          fVar71 = fVar70;
        }
        uVar25 = (ulong)*(uint *)(uVar28 + 0x14);
        pfVar4 = pfVar27 + uVar25;
        fVar108 = pfVar4[1];
        pfVar1 = pfVar4 + uVar24;
        fVar144 = pfVar1[1];
        fVar145 = pfVar1[2];
        fVar109 = pfVar4[2];
        if (uVar24 == 2) {
          fVar145 = fVar144;
          fVar109 = fVar108;
        }
        pfVar2 = pfVar27 + uVar25 * 2;
        fVar168 = pfVar2[1];
        pfVar3 = pfVar2 + uVar24;
        fVar176 = pfVar3[1];
        fVar156 = pfVar2[2];
        fVar177 = pfVar3[2];
        if (uVar24 == 2) {
          fVar156 = fVar168;
          fVar177 = fVar176;
        }
        fVar83 = *(float *)&This->ptr;
        fVar95 = *(float *)((long)&This->ptr + 4);
        fVar110 = *(float *)&This->leafIntersector;
        fVar178 = *(float *)&(This->collider).collide;
        local_1238._4_4_ = *(float *)((long)&(This->collider).collide + 4);
        fStack_1240 = *(float *)&(This->collider).name;
        fVar133 = *pfVar27 - fVar83;
        fVar139 = *pfVar5 - fVar83;
        fStack_1140 = fVar94 - fVar83;
        fStack_113c = fVar70 - fVar83;
        fVar147 = *pfVar4 - fVar95;
        fVar151 = *pfVar1 - fVar95;
        fStack_1150 = fVar108 - fVar95;
        fStack_114c = fVar144 - fVar95;
        fVar154 = *pfVar2 - fVar110;
        fVar155 = *pfVar3 - fVar110;
        fStack_1200 = fVar168 - fVar110;
        fStack_11fc = fVar176 - fVar110;
        fVar82 = fVar94 - fVar83;
        fVar94 = fVar94 - fVar83;
        fVar96 = fVar97 - fVar83;
        fVar97 = fVar97 - fVar83;
        fVar98 = fVar108 - fVar95;
        fVar108 = fVar108 - fVar95;
        fVar150 = fVar109 - fVar95;
        fVar109 = fVar109 - fVar95;
        fVar165 = fVar168 - fVar110;
        fVar168 = fVar168 - fVar110;
        fVar169 = fVar156 - fVar110;
        fVar156 = fVar156 - fVar110;
        fVar41 = *pfVar5 - fVar83;
        fVar146 = fVar70 - fVar83;
        fVar70 = fVar70 - fVar83;
        fVar71 = fVar71 - fVar83;
        fVar153 = *pfVar1 - fVar95;
        fVar143 = fVar144 - fVar95;
        fVar144 = fVar144 - fVar95;
        fVar145 = fVar145 - fVar95;
        fVar170 = *pfVar3 - fVar110;
        fVar175 = fVar176 - fVar110;
        fVar176 = fVar176 - fVar110;
        fVar177 = fVar177 - fVar110;
        fVar157 = fVar41 - fVar133;
        fVar161 = fVar146 - fVar139;
        fStack_11d0 = fVar70 - fStack_1140;
        fStack_11cc = fVar71 - fStack_113c;
        fVar83 = fVar153 - fVar147;
        fVar95 = fVar143 - fVar151;
        fStack_1210 = fVar144 - fStack_1150;
        fStack_120c = fVar145 - fStack_114c;
        fVar179 = fVar170 - fVar154;
        fVar183 = fVar175 - fVar155;
        fStack_11e0 = fVar176 - fStack_1200;
        fStack_11dc = fVar177 - fStack_11fc;
        local_11e8 = CONCAT44(fVar183,fVar179);
        local_1218 = (Scene *)CONCAT44(fVar95,fVar83);
        local_11d8 = (undefined4 *)CONCAT44(fVar161,fVar157);
        local_1248 = (RayQueryContext *)CONCAT44(fStack_1240,fStack_1240);
        fStack_123c = fStack_1240;
        fVar152 = fVar147 - fVar98;
        fVar127 = fVar151 - fVar108;
        fVar129 = fStack_1150 - fVar150;
        fVar131 = fStack_114c - fVar109;
        local_1228 = (fVar83 * (fVar170 + fVar154) - fVar179 * (fVar153 + fVar147)) * fVar178 +
                     (fVar179 * (fVar41 + fVar133) - (fVar170 + fVar154) * fVar157) *
                     (float)local_1238._4_4_ +
                     ((fVar153 + fVar147) * fVar157 - (fVar41 + fVar133) * fVar83) * fStack_1240;
        fStack_1224 = (fVar95 * (fVar175 + fVar155) - fVar183 * (fVar143 + fVar151)) * fVar178 +
                      (fVar183 * (fVar146 + fVar139) - (fVar175 + fVar155) * fVar161) *
                      (float)local_1238._4_4_ +
                      ((fVar143 + fVar151) * fVar161 - (fVar146 + fVar139) * fVar95) * fStack_1240;
        fStack_1220 = (fStack_1210 * (fVar176 + fStack_1200) - fStack_11e0 * (fVar144 + fStack_1150)
                      ) * fVar178 +
                      (fStack_11e0 * (fVar70 + fStack_1140) - (fVar176 + fStack_1200) * fStack_11d0)
                      * (float)local_1238._4_4_ +
                      ((fVar144 + fStack_1150) * fStack_11d0 - (fVar70 + fStack_1140) * fStack_1210)
                      * fStack_1240;
        fStack_121c = (fStack_120c * (fVar177 + fStack_11fc) - fStack_11dc * (fVar145 + fStack_114c)
                      ) * fVar178 +
                      (fStack_11dc * (fVar71 + fStack_113c) - (fVar177 + fStack_11fc) * fStack_11cc)
                      * (float)local_1238._4_4_ +
                      ((fVar145 + fStack_114c) * fStack_11cc - (fVar71 + fStack_113c) * fStack_120c)
                      * fStack_1240;
        fVar180 = fVar154 - fVar165;
        fVar184 = fVar155 - fVar168;
        fVar185 = fStack_1200 - fVar169;
        fVar186 = fStack_11fc - fVar156;
        local_1158 = CONCAT44(fVar151,fVar147);
        local_1208 = (RayQueryContext *)CONCAT44(fVar155,fVar154);
        fVar158 = fVar133 - fVar82;
        fVar162 = fVar139 - fVar94;
        fVar163 = fStack_1140 - fVar96;
        fVar164 = fStack_113c - fVar97;
        local_1148 = CONCAT44(fVar139,fVar133);
        local_10e8 = (fVar152 * (fVar154 + fVar165) - fVar180 * (fVar147 + fVar98)) * fVar178 +
                     (fVar180 * (fVar133 + fVar82) - (fVar154 + fVar165) * fVar158) *
                     (float)local_1238._4_4_ +
                     ((fVar147 + fVar98) * fVar158 - (fVar133 + fVar82) * fVar152) * fStack_1240;
        fStack_10e4 = (fVar127 * (fVar155 + fVar168) - fVar184 * (fVar151 + fVar108)) * fVar178 +
                      (fVar184 * (fVar139 + fVar94) - (fVar155 + fVar168) * fVar162) *
                      (float)local_1238._4_4_ +
                      ((fVar151 + fVar108) * fVar162 - (fVar139 + fVar94) * fVar127) * fStack_1240;
        auVar92._0_8_ = CONCAT44(fStack_10e4,local_10e8);
        auVar92._8_4_ =
             (fVar129 * (fStack_1200 + fVar169) - fVar185 * (fStack_1150 + fVar150)) * fVar178 +
             (fVar185 * (fStack_1140 + fVar96) - (fStack_1200 + fVar169) * fVar163) *
             (float)local_1238._4_4_ +
             ((fStack_1150 + fVar150) * fVar163 - (fStack_1140 + fVar96) * fVar129) * fStack_1240;
        auVar92._12_4_ =
             (fVar131 * (fStack_11fc + fVar156) - fVar186 * (fStack_114c + fVar109)) * fVar178 +
             (fVar186 * (fStack_113c + fVar97) - (fStack_11fc + fVar156) * fVar164) *
             (float)local_1238._4_4_ +
             ((fStack_114c + fVar109) * fVar164 - (fStack_113c + fVar97) * fVar131) * fStack_1240;
        local_1028 = fVar82 - fVar41;
        fStack_1024 = fVar94 - fVar146;
        fStack_1020 = fVar96 - fVar70;
        fStack_101c = fVar97 - fVar71;
        fVar134 = fVar98 - fVar153;
        fVar140 = fVar108 - fVar143;
        fVar141 = fVar150 - fVar144;
        fVar142 = fVar109 - fVar145;
        fVar110 = fVar165 - fVar170;
        fVar114 = fVar168 - fVar175;
        fVar115 = fVar169 - fVar176;
        fVar116 = fVar156 - fVar177;
        fStack_1160 = auVar92._8_4_;
        local_1168 = (undefined1  [8])auVar92._0_8_;
        fStack_115c = auVar92._12_4_;
        local_1238._0_4_ = local_1238._4_4_;
        fStack_1230 = (float)local_1238._4_4_;
        fStack_122c = (float)local_1238._4_4_;
        auVar104._0_4_ =
             (fVar134 * (fVar170 + fVar165) - fVar110 * (fVar153 + fVar98)) * fVar178 +
             (fVar110 * (fVar41 + fVar82) - (fVar170 + fVar165) * local_1028) *
             (float)local_1238._4_4_ +
             ((fVar153 + fVar98) * local_1028 - (fVar41 + fVar82) * fVar134) * fStack_1240;
        auVar104._4_4_ =
             (fVar140 * (fVar175 + fVar168) - fVar114 * (fVar143 + fVar108)) * fVar178 +
             (fVar114 * (fVar146 + fVar94) - (fVar175 + fVar168) * fStack_1024) *
             (float)local_1238._4_4_ +
             ((fVar143 + fVar108) * fStack_1024 - (fVar146 + fVar94) * fVar140) * fStack_1240;
        auVar104._8_4_ =
             (fVar141 * (fVar176 + fVar169) - fVar115 * (fVar144 + fVar150)) * fVar178 +
             (fVar115 * (fVar70 + fVar96) - (fVar176 + fVar169) * fStack_1020) *
             (float)local_1238._4_4_ +
             ((fVar144 + fVar150) * fStack_1020 - (fVar70 + fVar96) * fVar141) * fStack_1240;
        auVar104._12_4_ =
             (fVar142 * (fVar177 + fVar156) - fVar116 * (fVar145 + fVar109)) * fVar178 +
             (fVar116 * (fVar71 + fVar97) - (fVar177 + fVar156) * fStack_101c) *
             (float)local_1238._4_4_ +
             ((fVar145 + fVar109) * fStack_101c - (fVar71 + fVar97) * fVar142) * fStack_1240;
        auVar20._4_4_ = fStack_1224;
        auVar20._0_4_ = local_1228;
        auVar20._8_4_ = fStack_1220;
        auVar20._12_4_ = fStack_121c;
        local_10d8 = local_1228 + local_10e8 + auVar104._0_4_;
        fStack_10d4 = fStack_1224 + fStack_10e4 + auVar104._4_4_;
        fStack_10d0 = fStack_1220 + auVar92._8_4_ + auVar104._8_4_;
        fStack_10cc = fStack_121c + auVar92._12_4_ + auVar104._12_4_;
        auVar149 = minps(auVar20,auVar92);
        auVar149 = minps(auVar149,auVar104);
        auVar148 = maxps(auVar20,auVar92);
        auVar148 = maxps(auVar148,auVar104);
        local_1038 = ABS(local_10d8);
        fStack_1034 = ABS(fStack_10d4);
        fStack_1030 = ABS(fStack_10d0);
        fStack_102c = ABS(fStack_10cc);
        context = (RayQueryContext *)(uVar25 * 0xc);
        local_11b0 = (undefined1 (*) [16])(pfVar27 + uVar25 * 3);
        local_11a8 = uVar24;
        local_11a0 = uVar34;
        auVar167._0_4_ =
             -(uint)(auVar148._0_4_ <= local_1038 * 1.1920929e-07 ||
                    -(local_1038 * 1.1920929e-07) <= auVar149._0_4_) & local_1008;
        auVar167._4_4_ =
             -(uint)(auVar148._4_4_ <= fStack_1034 * 1.1920929e-07 ||
                    -(fStack_1034 * 1.1920929e-07) <= auVar149._4_4_) & uStack_1004;
        auVar167._8_4_ =
             -(uint)(auVar148._8_4_ <= fStack_1030 * 1.1920929e-07 ||
                    -(fStack_1030 * 1.1920929e-07) <= auVar149._8_4_) & uStack_1000;
        auVar167._12_4_ =
             -(uint)(auVar148._12_4_ <= fStack_102c * 1.1920929e-07 ||
                    -(fStack_102c * 1.1920929e-07) <= auVar149._12_4_) & uStack_ffc;
        iVar22 = movmskps((int)local_11b0,auVar167);
        if (iVar22 != 0) {
          auVar173._0_4_ = fVar83 * fVar180 - fVar179 * fVar152;
          auVar173._4_4_ = fVar95 * fVar184 - fVar183 * fVar127;
          auVar173._8_4_ = fStack_1210 * fVar185 - fStack_11e0 * fVar129;
          auVar173._12_4_ = fStack_120c * fVar186 - fStack_11dc * fVar131;
          auVar122._0_4_ = fVar152 * fVar110 - fVar180 * fVar134;
          auVar122._4_4_ = fVar127 * fVar114 - fVar184 * fVar140;
          auVar122._8_4_ = fVar129 * fVar115 - fVar185 * fVar141;
          auVar122._12_4_ = fVar131 * fVar116 - fVar186 * fVar142;
          uVar29 = (uint)DAT_01f46710;
          uVar128 = DAT_01f46710._4_4_;
          uVar130 = DAT_01f46710._8_4_;
          uVar132 = DAT_01f46710._12_4_;
          auVar59._4_4_ =
               -(uint)((float)((uint)(fVar183 * fVar127) & uVar128) <
                      (float)((uint)(fVar184 * fVar140) & uVar128));
          auVar59._0_4_ =
               -(uint)((float)((uint)(fVar179 * fVar152) & uVar29) <
                      (float)((uint)(fVar180 * fVar134) & uVar29));
          auVar59._8_4_ =
               -(uint)((float)((uint)(fStack_11e0 * fVar129) & uVar130) <
                      (float)((uint)(fVar185 * fVar141) & uVar130));
          auVar59._12_4_ =
               -(uint)((float)((uint)(fStack_11dc * fVar131) & uVar132) <
                      (float)((uint)(fVar186 * fVar142) & uVar132));
          local_1078 = blendvps(auVar122,auVar173,auVar59);
          auVar137._0_4_ = fVar179 * fVar158 - fVar157 * fVar180;
          auVar137._4_4_ = fVar183 * fVar162 - fVar161 * fVar184;
          auVar137._8_4_ = fStack_11e0 * fVar163 - fStack_11d0 * fVar185;
          auVar137._12_4_ = fStack_11dc * fVar164 - fStack_11cc * fVar186;
          auVar182._0_4_ = fVar180 * local_1028 - fVar158 * fVar110;
          auVar182._4_4_ = fVar184 * fStack_1024 - fVar162 * fVar114;
          auVar182._8_4_ = fVar185 * fStack_1020 - fVar163 * fVar115;
          auVar182._12_4_ = fVar186 * fStack_101c - fVar164 * fVar116;
          auVar60._4_4_ =
               -(uint)((float)((uint)(fVar161 * fVar184) & uVar128) <
                      (float)((uint)(fVar162 * fVar114) & uVar128));
          auVar60._0_4_ =
               -(uint)((float)((uint)(fVar157 * fVar180) & uVar29) <
                      (float)((uint)(fVar158 * fVar110) & uVar29));
          auVar60._8_4_ =
               -(uint)((float)((uint)(fStack_11d0 * fVar185) & uVar130) <
                      (float)((uint)(fVar163 * fVar115) & uVar130));
          auVar60._12_4_ =
               -(uint)((float)((uint)(fStack_11cc * fVar186) & uVar132) <
                      (float)((uint)(fVar164 * fVar116) & uVar132));
          local_1068 = blendvps(auVar182,auVar137,auVar60);
          auVar160._0_4_ = fVar158 * fVar134 - fVar152 * local_1028;
          auVar160._4_4_ = fVar162 * fVar140 - fVar127 * fStack_1024;
          auVar160._8_4_ = fVar163 * fVar141 - fVar129 * fStack_1020;
          auVar160._12_4_ = fVar164 * fVar142 - fVar131 * fStack_101c;
          auVar61._4_4_ =
               -(uint)((float)((uint)(fVar95 * fVar162) & uVar128) <
                      (float)((uint)(fVar127 * fStack_1024) & uVar128));
          auVar61._0_4_ =
               -(uint)((float)((uint)(fVar83 * fVar158) & uVar29) <
                      (float)((uint)(fVar152 * local_1028) & uVar29));
          auVar61._8_4_ =
               -(uint)((float)((uint)(fStack_1210 * fVar163) & uVar130) <
                      (float)((uint)(fVar129 * fStack_1020) & uVar130));
          auVar61._12_4_ =
               -(uint)((float)((uint)(fStack_120c * fVar164) & uVar132) <
                      (float)((uint)(fVar131 * fStack_101c) & uVar132));
          auVar14._4_4_ = fVar161 * fVar127 - fVar95 * fVar162;
          auVar14._0_4_ = fVar157 * fVar152 - fVar83 * fVar158;
          auVar14._8_4_ = fStack_11d0 * fVar129 - fStack_1210 * fVar163;
          auVar14._12_4_ = fStack_11cc * fVar131 - fStack_120c * fVar164;
          local_1058 = blendvps(auVar160,auVar14,auVar61);
          fVar94 = fVar178 * local_1078._0_4_ +
                   (float)local_1238._4_4_ * local_1068._0_4_ + fStack_1240 * local_1058._0_4_;
          fVar70 = fVar178 * local_1078._4_4_ +
                   (float)local_1238._4_4_ * local_1068._4_4_ + fStack_1240 * local_1058._4_4_;
          fVar97 = fVar178 * local_1078._8_4_ +
                   (float)local_1238._4_4_ * local_1068._8_4_ + fStack_1240 * local_1058._8_4_;
          fVar71 = fVar178 * local_1078._12_4_ +
                   (float)local_1238._4_4_ * local_1068._12_4_ + fStack_1240 * local_1058._12_4_;
          auVar75._0_4_ = fVar94 + fVar94;
          auVar75._4_4_ = fVar70 + fVar70;
          auVar75._8_4_ = fVar97 + fVar97;
          auVar75._12_4_ = fVar71 + fVar71;
          auVar62._0_4_ = fVar154 * local_1058._0_4_;
          auVar62._4_4_ = fVar155 * local_1058._4_4_;
          auVar62._8_4_ = fStack_1200 * local_1058._8_4_;
          auVar62._12_4_ = fStack_11fc * local_1058._12_4_;
          fVar70 = fVar133 * local_1078._0_4_ + fVar147 * local_1068._0_4_ + auVar62._0_4_;
          fVar144 = fVar139 * local_1078._4_4_ + fVar151 * local_1068._4_4_ + auVar62._4_4_;
          fVar145 = fStack_1140 * local_1078._8_4_ + fStack_1150 * local_1068._8_4_ + auVar62._8_4_;
          fVar109 = fStack_113c * local_1078._12_4_ +
                    fStack_114c * local_1068._12_4_ + auVar62._12_4_;
          auVar149 = rcpps(auVar62,auVar75);
          fVar94 = auVar149._0_4_;
          fVar97 = auVar149._4_4_;
          fVar71 = auVar149._8_4_;
          fVar108 = auVar149._12_4_;
          fVar70 = ((1.0 - auVar75._0_4_ * fVar94) * fVar94 + fVar94) * (fVar70 + fVar70);
          fVar97 = ((1.0 - auVar75._4_4_ * fVar97) * fVar97 + fVar97) * (fVar144 + fVar144);
          fVar71 = ((1.0 - auVar75._8_4_ * fVar71) * fVar71 + fVar71) * (fVar145 + fVar145);
          fVar108 = ((1.0 - auVar75._12_4_ * fVar108) * fVar108 + fVar108) * (fVar109 + fVar109);
          local_1268._0_8_ = (This->intersector1).intersect;
          local_1268._8_8_ = (This->intersector1).occluded;
          fVar144 = (float)local_1268._0_8_;
          fVar94 = *(float *)((long)&This->leafIntersector + 4);
          auVar63._4_4_ = -(uint)(fVar94 <= fVar97);
          auVar63._0_4_ = -(uint)(fVar94 <= fVar70);
          auVar63._8_4_ = -(uint)(fVar94 <= fVar71);
          auVar63._12_4_ = -(uint)(fVar94 <= fVar108);
          auVar76._0_4_ =
               (int)((uint)(auVar75._0_4_ != 0.0 && (fVar70 <= fVar144 && fVar94 <= fVar70)) *
                    -0x80000000) >> 0x1f;
          auVar76._4_4_ =
               (int)((uint)(auVar75._4_4_ != 0.0 && (fVar97 <= fVar144 && fVar94 <= fVar97)) *
                    -0x80000000) >> 0x1f;
          auVar76._8_4_ =
               (int)((uint)(auVar75._8_4_ != 0.0 && (fVar71 <= fVar144 && fVar94 <= fVar71)) *
                    -0x80000000) >> 0x1f;
          auVar76._12_4_ =
               (int)((uint)(auVar75._12_4_ != 0.0 && (fVar108 <= fVar144 && fVar94 <= fVar108)) *
                    -0x80000000) >> 0x1f;
          auVar77 = auVar76 & auVar167;
          iVar22 = movmskps(iVar22,auVar77);
          if (iVar22 != 0) {
            uVar29 = *(uint *)(uVar28 + 0x18);
            uVar25 = (ulong)uVar29;
            uVar33 = *(undefined4 *)(uVar28 + 0x1c);
            uVar26 = extractps(local_1268,1);
            local_10f8._4_4_ = fStack_1224;
            local_10f8._0_4_ = local_1228;
            fStack_10f0 = fStack_1220;
            fStack_10ec = fStack_121c;
            fStack_10e0 = auVar92._8_4_;
            fStack_10dc = auVar92._12_4_;
            local_10c8 = &local_11b0;
            local_10b8 = auVar77;
            local_1088[0] = fVar70;
            local_1088[1] = fVar97;
            local_1088[2] = fVar71;
            local_1088[3] = fVar108;
            context = *(RayQueryContext **)(*(long *)&(ray->super_RayK<1>).org.field_0 + 0x1e8);
            pSVar36 = (&context->scene)[uVar25];
            if ((*(uint *)((long)&(pSVar36->super_AccelN).super_Accel.super_AccelData.bounds.bounds1
                                  .lower + 4) & (uint)uVar26) != 0) {
              local_11c8 = auVar77;
              auVar12._4_4_ = fStack_10d4;
              auVar12._0_4_ = local_10d8;
              auVar12._8_4_ = fStack_10d0;
              auVar12._12_4_ = fStack_10cc;
              auVar149 = rcpps(auVar63,auVar12);
              fVar94 = auVar149._0_4_;
              fVar144 = auVar149._4_4_;
              fVar145 = auVar149._8_4_;
              fVar109 = auVar149._12_4_;
              fVar94 = (float)(-(uint)(1e-18 <= local_1038) &
                              (uint)(((float)DAT_01f46a60 - local_10d8 * fVar94) * fVar94 + fVar94))
              ;
              fVar144 = (float)(-(uint)(1e-18 <= fStack_1034) &
                               (uint)((DAT_01f46a60._4_4_ - fStack_10d4 * fVar144) * fVar144 +
                                     fVar144));
              fVar145 = (float)(-(uint)(1e-18 <= fStack_1030) &
                               (uint)((DAT_01f46a60._8_4_ - fStack_10d0 * fVar145) * fVar145 +
                                     fVar145));
              fVar109 = (float)(-(uint)(1e-18 <= fStack_102c) &
                               (uint)((DAT_01f46a60._12_4_ - fStack_10cc * fVar109) * fVar109 +
                                     fVar109));
              auVar138._0_4_ = local_1228 * fVar94;
              auVar138._4_4_ = fStack_1224 * fVar144;
              auVar138._8_4_ = fStack_1220 * fVar145;
              auVar138._12_4_ = fStack_121c * fVar109;
              auVar87 = minps(auVar138,_DAT_01f46a60);
              auVar174._0_4_ = local_10e8 * fVar94;
              auVar174._4_4_ = fStack_10e4 * fVar144;
              auVar174._8_4_ = auVar92._8_4_ * fVar145;
              auVar174._12_4_ = auVar92._12_4_ * fVar109;
              auVar113 = minps(auVar174,_DAT_01f46a60);
              auVar149 = *local_11b0;
              auVar118 = auVar149._0_12_;
              auVar148 = *(undefined1 (*) [16])(*local_11b0 + uVar24 * 4);
              auVar85 = auVar148._0_12_;
              fVar94 = auVar87._12_4_;
              if (uVar24 == 2) {
                auVar118._0_8_ = auVar149._0_8_;
                auVar118._8_4_ = auVar149._4_4_;
                auVar85._0_8_ = auVar148._0_8_;
                auVar85._8_4_ = auVar148._4_4_;
              }
              auVar123._4_4_ = auVar118._4_4_;
              auVar123._8_4_ = auVar118._8_4_;
              auVar65._0_8_ = auVar118._0_8_;
              auVar65._8_4_ = auVar123._4_4_;
              uVar130 = auVar85._4_4_;
              auVar65._12_4_ = uVar130;
              auVar64._8_8_ = auVar65._8_8_;
              auVar64._0_4_ = auVar118._0_4_;
              uVar128 = auVar85._0_4_;
              auVar64._4_4_ = uVar128;
              auVar123._0_4_ = auVar123._4_4_;
              auVar123._12_4_ = auVar123._8_4_;
              auVar93._0_8_ = auVar85._0_8_;
              auVar93._8_4_ = uVar130;
              auVar93._12_4_ = auVar85._8_4_;
              auVar149 = pblendw(auVar64,ZEXT816(0),0xaa);
              auVar120 = pblendw(auVar123,ZEXT816(0),0xaa);
              auVar148 = pblendw(auVar93,ZEXT816(0),0xaa);
              fVar176 = auVar87._0_4_;
              fVar156 = auVar87._4_4_;
              fVar177 = auVar87._8_4_;
              fVar83 = auVar113._0_4_;
              fVar95 = auVar113._4_4_;
              fVar110 = auVar113._8_4_;
              fVar178 = auVar113._12_4_;
              fVar144 = (1.0 - fVar176) - fVar83;
              fVar145 = (1.0 - fVar156) - fVar95;
              fVar109 = (1.0 - fVar177) - fVar110;
              fVar168 = (1.0 - fVar94) - fVar178;
              local_10a8[0] =
                   (float)auVar149._0_4_ * 0.00012207031 * fVar144 +
                   (float)auVar148._0_4_ * 0.00012207031 * fVar83 +
                   (float)auVar120._0_4_ * 0.00012207031 * fVar176;
              local_10a8[1] =
                   (float)auVar149._4_4_ * 0.00012207031 * fVar145 +
                   (float)auVar148._4_4_ * 0.00012207031 * fVar95 +
                   (float)auVar120._4_4_ * 0.00012207031 * fVar156;
              local_10a8[2] =
                   (float)auVar149._8_4_ * 0.00012207031 * fVar109 +
                   (float)auVar148._8_4_ * 0.00012207031 * fVar110 +
                   (float)auVar120._8_4_ * 0.00012207031 * fVar177;
              local_10a8[3] =
                   (float)auVar149._12_4_ * 0.00012207031 * fVar168 +
                   (float)auVar148._12_4_ * 0.00012207031 * fVar178 +
                   (float)auVar120._12_4_ * 0.00012207031 * fVar94;
              local_1098[0] =
                   fVar144 * (float)(auVar64._0_4_ >> 0x10) * 0.00012207031 +
                   (float)(uVar128 >> 0x10) * 0.00012207031 * fVar83 +
                   (float)(auVar123._4_4_ >> 0x10) * 0.00012207031 * fVar176;
              local_1098[1] =
                   fVar145 * (float)(uVar128 >> 0x10) * 0.00012207031 +
                   (float)(uVar130 >> 0x10) * 0.00012207031 * fVar95 +
                   (float)(auVar123._4_4_ >> 0x10) * 0.00012207031 * fVar156;
              local_1098[2] =
                   fVar109 * (float)(auVar123._4_4_ >> 0x10) * 0.00012207031 +
                   (float)(uVar130 >> 0x10) * 0.00012207031 * fVar110 +
                   (float)(auVar123._8_4_ >> 0x10) * 0.00012207031 * fVar177;
              local_1098[3] =
                   fVar168 * (float)(uVar130 >> 0x10) * 0.00012207031 +
                   (float)(auVar85._8_4_ >> 0x10) * 0.00012207031 * fVar178 +
                   (float)(auVar123._8_4_ >> 0x10) * 0.00012207031 * fVar94;
              auVar16._4_4_ = fVar97;
              auVar16._0_4_ = fVar70;
              auVar16._8_4_ = fVar71;
              auVar16._12_4_ = fVar108;
              auVar148 = blendvps(_DAT_01f45a30,auVar16,auVar77);
              auVar105._4_4_ = auVar148._0_4_;
              auVar105._0_4_ = auVar148._4_4_;
              auVar105._8_4_ = auVar148._12_4_;
              auVar105._12_4_ = auVar148._8_4_;
              auVar149 = minps(auVar105,auVar148);
              auVar66._0_8_ = auVar149._8_8_;
              auVar66._8_4_ = auVar149._0_4_;
              auVar66._12_4_ = auVar149._4_4_;
              auVar149 = minps(auVar66,auVar149);
              auVar67._0_8_ =
                   CONCAT44(-(uint)(auVar149._4_4_ == auVar148._4_4_) & auVar77._4_4_,
                            -(uint)(auVar149._0_4_ == auVar148._0_4_) & auVar77._0_4_);
              auVar67._8_4_ = -(uint)(auVar149._8_4_ == auVar148._8_4_) & auVar77._8_4_;
              auVar67._12_4_ = -(uint)(auVar149._12_4_ == auVar148._12_4_) & auVar77._12_4_;
              iVar22 = movmskps((int)local_11b0,auVar67);
              if (iVar22 != 0) {
                auVar77._8_4_ = auVar67._8_4_;
                auVar77._0_8_ = auVar67._0_8_;
                auVar77._12_4_ = auVar67._12_4_;
              }
              uVar23 = movmskps(iVar22,auVar77);
              uVar24 = CONCAT44((int)((ulong)local_11b0 >> 0x20),uVar23);
              local_1248 = (RayQueryContext *)0x0;
              if (uVar24 != 0) {
                for (; (uVar24 >> (long)local_1248 & 1) == 0;
                    local_1248 = (RayQueryContext *)((long)local_1248 + 1)) {
                }
              }
              lVar35 = *(long *)&(ray->super_RayK<1>).dir.field_0;
              local_1228 = (float)lVar35;
              fStack_1224 = (float)((ulong)lVar35 >> 0x20);
              if ((*(long *)(lVar35 + 0x10) == 0) &&
                 (*(long *)&(pSVar36->super_AccelN).super_Accel.super_AccelData.bounds.bounds1.upper
                            .field_0 == 0)) {
                fVar94 = local_10a8[(long)local_1248];
                fVar70 = local_1098[(long)local_1248];
                uVar23 = *(undefined4 *)(local_1078 + (long)local_1248 * 4);
                uVar6 = *(undefined4 *)(local_1068 + (long)local_1248 * 4);
                uVar7 = *(undefined4 *)(local_1058 + (long)local_1248 * 4);
                *(float *)&(This->intersector1).intersect = local_1088[(long)local_1248];
                *(undefined4 *)&(This->intersector1).pointQuery = uVar23;
                *(undefined4 *)((long)&(This->intersector1).pointQuery + 4) = uVar6;
                *(undefined4 *)&(This->intersector1).name = uVar7;
                *(float *)((long)&(This->intersector1).name + 4) = fVar94;
                *(float *)&(This->intersector4).intersect = fVar70;
                *(undefined4 *)((long)&(This->intersector4).intersect + 4) = uVar33;
                *(uint *)&(This->intersector4).occluded = uVar29;
                puVar9 = *(uint **)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                uVar29 = *puVar9;
                context = (RayQueryContext *)(ulong)uVar29;
                *(uint *)((long)&(This->intersector4).occluded + 4) = uVar29;
                *(uint *)&(This->intersector4).name = puVar9[1];
              }
              else {
                local_1238 = (undefined1  [8])
                             *(undefined8 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
                local_1208._0_4_ = fVar70;
                local_1208._4_4_ = fVar97;
                fStack_1200 = fVar71;
                fStack_11fc = fVar108;
                local_11d8 = (undefined4 *)uVar25;
                local_11e8 = CONCAT44(fVar183,uVar33);
                local_1218 = pSVar36;
LAB_006a0e08:
                local_112c = local_10a8[(long)local_1248];
                local_1128 = local_1098[(long)local_1248];
                *(float *)&(This->intersector1).intersect = local_1088[(long)local_1248];
                local_1138 = *(float *)(local_1078 + (long)local_1248 * 4);
                local_1134 = *(undefined4 *)(local_1068 + (long)local_1248 * 4);
                local_1130 = *(undefined4 *)(local_1058 + (long)local_1248 * 4);
                local_1124 = uVar33;
                local_1120 = (int)uVar25;
                local_111c = *(float *)(Scene **)local_1238;
                local_1118 = *(float *)((long)(Scene **)local_1238 + 4);
                local_124c = -1;
                local_1198 = &local_124c;
                local_1190 = (Scene *)*(undefined8 *)
                                       ((long)&(pSVar36->super_AccelN).super_Accel.super_AccelData.
                                               bounds.bounds0.lower + 8);
                local_1188 = (RayQueryContext *)local_1238;
                local_1180 = This;
                local_1178 = &local_1138;
                local_1170 = 1;
                pcVar10 = *(code **)&(pSVar36->super_AccelN).super_Accel.super_AccelData.bounds.
                                     bounds1.upper.field_0;
                if (pcVar10 == (code *)0x0) {
LAB_006a0f38:
                  pcVar10 = *(code **)(CONCAT44(fStack_1224,local_1228) + 0x10);
                  if ((pcVar10 != (code *)0x0) &&
                     ((context = (RayQueryContext *)CONCAT44(fStack_1224,local_1228),
                      ((ulong)context->scene & 2) != 0 ||
                      ((*(byte *)((long)&(pSVar36->super_AccelN).super_Accel.super_AccelData.bounds.
                                         bounds1.lower + 0xe) & 0x40) != 0)))) {
                    (*pcVar10)(&local_1198);
                    This = local_11f0;
                    uVar25 = (ulong)local_11d8;
                    pSVar36 = local_1218;
                    uVar37 = local_11f8;
                    fVar70 = (float)local_1208;
                    fVar97 = local_1208._4_4_;
                    fVar71 = fStack_1200;
                    fVar108 = fStack_11fc;
                    uVar33 = (undefined4)local_11e8;
                    if (*local_1198 == 0) goto LAB_006a0ff8;
                  }
                  *(float *)&(local_1180->intersector1).pointQuery = *local_1178;
                  *(float *)((long)&(local_1180->intersector1).pointQuery + 4) = local_1178[1];
                  *(float *)&(local_1180->intersector1).name = local_1178[2];
                  *(float *)((long)&(local_1180->intersector1).name + 4) = local_1178[3];
                  *(float *)&(local_1180->intersector4).intersect = local_1178[4];
                  *(float *)((long)&(local_1180->intersector4).intersect + 4) = local_1178[5];
                  *(float *)&(local_1180->intersector4).occluded = local_1178[6];
                  *(float *)((long)&(local_1180->intersector4).occluded + 4) = local_1178[7];
                  context = (RayQueryContext *)(ulong)(uint)local_1178[8];
                  *(float *)&(local_1180->intersector4).name = local_1178[8];
                }
                else {
                  context = (RayQueryContext *)local_1238;
                  (*pcVar10)(&local_1198);
                  This = local_11f0;
                  uVar25 = (ulong)local_11d8;
                  pSVar36 = local_1218;
                  uVar37 = local_11f8;
                  fVar70 = (float)local_1208;
                  fVar97 = local_1208._4_4_;
                  fVar71 = fStack_1200;
                  fVar108 = fStack_11fc;
                  uVar33 = (undefined4)local_11e8;
                  if (*local_1198 != 0) goto LAB_006a0f38;
LAB_006a0ff8:
                  *(undefined4 *)&(local_11f0->intersector1).intersect = local_1268._0_4_;
                  This = local_11f0;
                  uVar25 = (ulong)local_11d8;
                  pSVar36 = local_1218;
                  uVar37 = local_11f8;
                  fVar70 = (float)local_1208;
                  fVar97 = local_1208._4_4_;
                  fVar71 = fStack_1200;
                  fVar108 = fStack_11fc;
                  uVar33 = (undefined4)local_11e8;
                }
                *(undefined4 *)(local_11c8 + (long)local_1248 * 4) = 0;
                local_1268._0_8_ = (This->intersector1).intersect;
                local_1268._8_8_ = (This->intersector1).occluded;
                fVar94 = (float)local_1268._0_8_;
                auVar69._0_4_ = -(uint)(fVar70 <= fVar94) & local_11c8._0_4_;
                auVar69._4_4_ = -(uint)(fVar97 <= fVar94) & local_11c8._4_4_;
                auVar69._8_4_ = -(uint)(fVar71 <= fVar94) & local_11c8._8_4_;
                auVar69._12_4_ = -(uint)(fVar108 <= fVar94) & local_11c8._12_4_;
                local_11c8 = auVar69;
                iVar22 = movmskps((int)local_1248,auVar69);
                if (iVar22 != 0) {
                  auVar17._4_4_ = fVar97;
                  auVar17._0_4_ = fVar70;
                  auVar17._8_4_ = fVar71;
                  auVar17._12_4_ = fVar108;
                  auVar148 = blendvps(_DAT_01f45a30,auVar17,auVar69);
                  auVar107._4_4_ = auVar148._0_4_;
                  auVar107._0_4_ = auVar148._4_4_;
                  auVar107._8_4_ = auVar148._12_4_;
                  auVar107._12_4_ = auVar148._8_4_;
                  auVar149 = minps(auVar107,auVar148);
                  auVar80._0_8_ = auVar149._8_8_;
                  auVar80._8_4_ = auVar149._0_4_;
                  auVar80._12_4_ = auVar149._4_4_;
                  auVar149 = minps(auVar80,auVar149);
                  auVar81._0_8_ =
                       CONCAT44(-(uint)(auVar149._4_4_ == auVar148._4_4_) & auVar69._4_4_,
                                -(uint)(auVar149._0_4_ == auVar148._0_4_) & auVar69._0_4_);
                  auVar81._8_4_ = -(uint)(auVar149._8_4_ == auVar148._8_4_) & auVar69._8_4_;
                  auVar81._12_4_ = -(uint)(auVar149._12_4_ == auVar148._12_4_) & auVar69._12_4_;
                  iVar22 = movmskps(iVar22,auVar81);
                  if (iVar22 != 0) {
                    auVar69._8_4_ = auVar81._8_4_;
                    auVar69._0_8_ = auVar81._0_8_;
                    auVar69._12_4_ = auVar81._12_4_;
                  }
                  uVar23 = movmskps(iVar22,auVar69);
                  uVar24 = CONCAT44((int)((ulong)local_1248 >> 0x20),uVar23);
                  local_1248 = (RayQueryContext *)0x0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> (long)local_1248 & 1) == 0;
                        local_1248 = (RayQueryContext *)((long)local_1248 + 1)) {
                    }
                  }
                  goto LAB_006a0e08;
                }
              }
            }
          }
        }
      }
      uVar33 = *(undefined4 *)&(This->intersector1).intersect;
      auVar148._4_4_ = uVar33;
      auVar148._0_4_ = uVar33;
      auVar148._8_4_ = uVar33;
      auVar148._12_4_ = uVar33;
      fVar97 = local_f88;
      fVar71 = fStack_f84;
      fVar144 = fStack_f80;
      fVar145 = fStack_f7c;
      fVar108 = local_f98;
      fVar109 = fStack_f94;
      fVar168 = fStack_f90;
      fVar176 = fStack_f8c;
      fVar156 = local_fb8;
      fVar177 = fStack_fb4;
      fVar83 = fStack_fb0;
      fVar95 = fStack_fac;
      fVar146 = local_1048;
      fVar110 = fStack_1044;
      fVar178 = fStack_1040;
      fVar41 = fStack_103c;
      fVar150 = local_1108;
      fVar82 = fStack_1104;
      fVar96 = fStack_1100;
      fVar98 = fStack_10fc;
      fVar152 = local_fa8;
      fVar114 = fStack_fa4;
      fVar115 = fStack_fa0;
      fVar116 = fStack_f9c;
      fVar94 = local_fc8;
      fVar127 = fStack_fc4;
      fVar129 = fStack_fc0;
      fVar131 = fStack_fbc;
      fVar70 = local_fd8;
      fVar133 = fStack_fd4;
      fVar134 = fStack_fd0;
      fVar139 = fStack_fcc;
      fVar153 = local_fe8;
      fVar140 = fStack_fe4;
      fVar141 = fStack_fe0;
      fVar142 = fStack_fdc;
      fVar154 = local_ff8;
      fVar143 = fStack_ff4;
      fVar147 = fStack_ff0;
      fVar151 = fStack_fec;
      goto LAB_0069fa09;
    }
    uVar28 = (ulong)pRVar30 & 0xfffffffffffffff0;
    context = *(RayQueryContext **)(uVar28 + 0x30 + (ulong)*(uint *)(uVar28 + 0x2c));
    uVar33 = *(undefined4 *)&(This->intersector1).intersect;
    auVar148._4_4_ = uVar33;
    auVar148._0_4_ = uVar33;
    auVar148._8_4_ = uVar33;
    auVar148._12_4_ = uVar33;
    if (context != (RayQueryContext *)0x0) {
      *(RayQueryContext **)*pauVar38 = context;
      *(undefined4 *)((long)*pauVar38 + 8) = 0;
      pauVar38 = pauVar38 + 1;
    }
  } while( true );
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }